

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSendQueue.cpp
# Opt level: O1

bool __thiscall Scs::SendQueue::Empty(SendQueue *this)

{
  _Elt_pointer psVar1;
  _Elt_pointer psVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar3 == 0) {
    psVar1 = (this->m_queue).
             super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    psVar2 = (this->m_queue).
             super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return psVar1 == psVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool SendQueue::Empty() const
{
	std::lock_guard<std::mutex> lock(m_mutex);
	return m_queue.empty();
}